

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

int __thiscall QAbstractItemViewPrivate::init(QAbstractItemViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  ScrollMode SVar1;
  QStyledItemDelegate *this_01;
  QStyle *pQVar2;
  ConnectionType type;
  long in_FS_OFFSET;
  Object local_50;
  
  local_50.super_QWidget.data = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  this_01 = (QStyledItemDelegate *)operator_new(0x10);
  QStyledItemDelegate::QStyledItemDelegate(this_01,&this_00->super_QObject);
  QAbstractItemView::setItemDelegate((QAbstractItemView *)this_00,(QAbstractItemDelegate *)this_01);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,0);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,0);
  type = (ConnectionType)this_00;
  QObject::connect<void(QAbstractSlider::*)(int),void(QAbstractItemView::*)(int)>
            (&local_50,
             (offset_in_QAbstractSlider_to_subr)(this->super_QAbstractScrollAreaPrivate).vbar,
             (ContextType *)QAbstractSlider::actionTriggered,
             (offset_in_QAbstractItemView_to_subr *)0x0,type);
  QObject::connect<void(QAbstractSlider::*)(int),void(QAbstractItemView::*)(int)>
            ((Object *)&local_50.super_QWidget.field_0x8,
             (offset_in_QAbstractSlider_to_subr)(this->super_QAbstractScrollAreaPrivate).hbar,
             (ContextType *)QAbstractSlider::actionTriggered,
             (offset_in_QAbstractItemView_to_subr *)0x0,type);
  QObject::connect<void(QAbstractSlider::*)(int),void(QAbstractItemView::*)(int)>
            ((Object *)&local_50.super_QWidget.super_QPaintDevice,
             (offset_in_QAbstractSlider_to_subr)(this->super_QAbstractScrollAreaPrivate).vbar,
             (ContextType *)QAbstractSlider::valueChanged,(offset_in_QAbstractItemView_to_subr *)0x0
             ,type);
  QObject::connect<void(QAbstractSlider::*)(int),void(QAbstractItemView::*)(int)>
            ((Object *)&local_50.super_QWidget.field_0x18,
             (offset_in_QAbstractSlider_to_subr)(this->super_QAbstractScrollAreaPrivate).hbar,
             (ContextType *)QAbstractSlider::valueChanged,(offset_in_QAbstractItemView_to_subr *)0x0
             ,type);
  std::array<QMetaObject::Connection,_4UL>::operator=
            (&this->scrollbarConnections,(array<QMetaObject::Connection,_4UL> *)&local_50);
  std::array<QMetaObject::Connection,_4UL>::~array((array<QMetaObject::Connection,_4UL> *)&local_50)
  ;
  QWidget::setBackgroundRole((this->super_QAbstractScrollAreaPrivate).viewport,Base);
  QWidget::setAttribute(this_00,WA_InputMethodEnabled,true);
  pQVar2 = QWidget::style(this_00);
  SVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x6f,0,this_00,0);
  this->verticalScrollMode = SVar1;
  pQVar2 = QWidget::style(this_00);
  SVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x6f,0,this_00,0);
  this->horizontalScrollMode = SVar1;
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_50.super_QWidget.data) {
    return (int)*(QWidgetData **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::init()
{
    Q_Q(QAbstractItemView);
    q->setItemDelegate(new QStyledItemDelegate(q));

    vbar->setRange(0, 0);
    hbar->setRange(0, 0);

    scrollbarConnections = {
        QObject::connect(vbar, &QScrollBar::actionTriggered,
                         q, &QAbstractItemView::verticalScrollbarAction),
        QObject::connect(hbar, &QScrollBar::actionTriggered,
                         q, &QAbstractItemView::horizontalScrollbarAction),
        QObject::connect(vbar, &QScrollBar::valueChanged,
                         q, &QAbstractItemView::verticalScrollbarValueChanged),
        QObject::connect(hbar, &QScrollBar::valueChanged,
                         q, &QAbstractItemView::horizontalScrollbarValueChanged)
    };
    viewport->setBackgroundRole(QPalette::Base);

    q->setAttribute(Qt::WA_InputMethodEnabled);

    verticalScrollMode = static_cast<QAbstractItemView::ScrollMode>(q->style()->styleHint(QStyle::SH_ItemView_ScrollMode, nullptr, q, nullptr));
    horizontalScrollMode = static_cast<QAbstractItemView::ScrollMode>(q->style()->styleHint(QStyle::SH_ItemView_ScrollMode, nullptr, q, nullptr));
}